

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

uchar * objures(objucxdef *undoctx,uchar cmd,ushort siz)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  
  uVar3 = siz + 3;
  if (undoctx->objucxsiz < uVar3) {
    errsigf(undoctx->objucxerr,"TADS",200);
  }
  uVar2 = undoctx->objucxhead;
  uVar4 = undoctx->objucxprv;
  if (uVar2 == uVar4) {
    undoctx->objucxtop = 0;
    undoctx->objucxtail = 0;
    undoctx->objucxprv = 0;
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    uVar1 = undoctx->objucxtail;
    if (uVar2 <= uVar1) goto LAB_0012c052;
    iVar5 = (uint)undoctx->objucxsiz - (uint)uVar2;
    while (iVar5 < (int)(uint)uVar3) {
      undoctx->objucxtop = uVar4;
      undoctx->objucxhead = 0;
      uVar2 = 0;
LAB_0012c052:
      do {
        if ((int)(uint)uVar3 <= (int)((uint)uVar1 - (uint)uVar2)) {
          uVar4 = undoctx->objucxprv;
          goto LAB_0012c087;
        }
        objutadv(undoctx);
        uVar2 = undoctx->objucxhead;
        uVar1 = undoctx->objucxtail;
      } while (uVar2 < uVar1);
      uVar4 = undoctx->objucxprv;
      iVar5 = (uint)undoctx->objucxsiz - (uint)uVar2;
    }
  }
LAB_0012c087:
  undoctx->objucxprv = uVar2;
  undoctx->objucxbuf[uVar2] = cmd;
  *(ushort *)(undoctx->objucxbuf + (ulong)uVar2 + 1) = uVar4;
  undoctx->objucxhead = uVar2 + 3;
  if (undoctx->objucxtop < uVar2) {
    undoctx->objucxtop = uVar2;
  }
  return undoctx->objucxbuf + (ushort)(uVar2 + 3);
}

Assistant:

uchar *objures(objucxdef *undoctx, uchar cmd, ushort siz)
{
    ushort  prv;
    uchar  *p;
    
    /* adjust size to include header information */
    siz += 1 + sizeof(ushort);
    
    /* make sure there's enough room overall for the record */
    if (siz > undoctx->objucxsiz) errsig(undoctx->objucxerr, ERR_UNDOVF);
    
    /* if there's no information, reset buffers */
    if (undoctx->objucxhead == undoctx->objucxprv)
    {
        undoctx->objucxhead = undoctx->objucxprv = undoctx->objucxtail = 0;
        undoctx->objucxtop = 0;
        goto done;
    }
    
    /* if tail is below head, we can use to top of entire buffer */
    if (undoctx->objucxtail < undoctx->objucxhead)
    {
        /* if there's enough space left after head, we're done */
        if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
            goto done;
        
        /* insufficient space:  wrap head down to bottom of buffer */
        undoctx->objucxtop = undoctx->objucxprv;            /* last was top */
        undoctx->objucxhead = 0;
    }
    
    /* head is below tail:  delete records until we have enough room */
    while (undoctx->objucxtail - undoctx->objucxhead < siz)
    {
        objutadv(undoctx);
        
        /* if the tail wrapped, advancing won't do any more good */
        if (undoctx->objucxtail <= undoctx->objucxhead)
        {
            /* if there's enough room at the top, we're done */
            if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
                goto done;
            
            /* still not enough room; wrap the head this time */
            undoctx->objucxtop = undoctx->objucxprv;        /* last was top */
            undoctx->objucxhead = 0;
        }
    }
    
done:
    /* save back-link, and set objucxprv pointer to the new record */
    prv = undoctx->objucxprv;
    undoctx->objucxprv = undoctx->objucxhead;
    
    /* write the header:  command byte, back-link to previous record */
    p = &undoctx->objucxbuf[undoctx->objucxhead];
    *p++ = cmd;
    memcpy(p, &prv, sizeof(prv));
    
    /* advance the head pointer past the header */
    undoctx->objucxhead += 1 + sizeof(prv);
    
    /* set the high-water mark if we've exceeded the old one */
    if (undoctx->objucxprv > undoctx->objucxtop)
        undoctx->objucxtop = undoctx->objucxprv;

    /* return the reserved space */
    return &undoctx->objucxbuf[undoctx->objucxhead];
}